

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::addRenameCommand_abi_cxx11_(CommandLine *this,string_view value)

{
  mapped_type *this_00;
  allocator<char> *in_RSI;
  string *in_RDI;
  string_view slangName;
  size_t lastCommaIndex;
  size_t firstCommaIndex;
  undefined1 in_stack_00000120 [16];
  undefined1 in_stack_00000130 [16];
  undefined7 in_stack_fffffffffffffeb8;
  char in_stack_fffffffffffffebf;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec8;
  value<fmt::v11::context> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_type in_stack_fffffffffffffed8;
  string *this_02;
  key_type *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  allocator<char> local_f1 [33];
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  char *local_b0;
  undefined8 local_a8;
  size_type local_a0;
  size_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [24];
  undefined8 local_50;
  undefined1 *local_48;
  char *local_40;
  undefined8 local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char *local_28;
  undefined8 local_20;
  undefined1 *local_10;
  undefined8 *local_8;
  
  this_02 = in_RDI;
  local_98 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                       (in_stack_fffffffffffffec0,in_stack_fffffffffffffebf,0x349337);
  local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                       (in_stack_fffffffffffffec0,in_stack_fffffffffffffebf,0x349358);
  if ((local_98 == 0xffffffffffffffff) || (local_98 != local_a0)) {
    local_b0 = "missing or extra comma in argument \'{}\'";
    local_a8 = 0x27;
    local_28 = "missing or extra comma in argument \'{}\'";
    local_20 = 0x27;
    local_30 = &local_88;
    local_40 = "missing or extra comma in argument \'{}\'";
    local_38 = 0x27;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_8 = &local_50;
    local_10 = local_68;
    local_50 = 0xd;
    local_48 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000130,(format_args)in_stack_00000120);
  }
  else {
    this_01 = &local_88;
    local_c0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)this_02,
                          in_stack_fffffffffffffed8,(size_type)this_01);
    local_d0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)this_02,
                          in_stack_fffffffffffffed8,(size_type)this_01);
    local_88._M_dataplus._M_p = (pointer)local_d0._M_len;
    local_88._M_string_length = (size_type)local_d0._M_str;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffff00,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef8,in_RSI)
    ;
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::operator=
              (this_00,(basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator(local_f1);
    std::__cxx11::string::string(this_01);
  }
  return in_RDI;
}

Assistant:

std::string CommandLine::addRenameCommand(std::string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == std::string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const std::string_view slangName = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);
    cmdRename[std::string(value)] = slangName;
    return {};
}